

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::GetNormalHeapBlockAllocatorInfoForNativeAllocation
          (Recycler *this,size_t allocSize,void **allocatorAddress,uint32 *endAddressOffset,
          uint32 *freeListOffset,bool allowBumpAllocation,bool isOOPJIT)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  uint uVar6;
  uint32 uVar7;
  uint32 uVar8;
  char *pcVar9;
  undefined8 *in_FS_OFFSET;
  bool isOOPJIT_local;
  bool allowBumpAllocation_local;
  uint32 *freeListOffset_local;
  uint32 *endAddressOffset_local;
  void **allocatorAddress_local;
  size_t allocSize_local;
  Recycler *this_local;
  
  BVar4 = HeapInfo::IsAlignedSize(allocSize);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x59a,"(HeapInfo::IsAlignedSize(allocSize))",
                       "HeapInfo::IsAlignedSize(allocSize)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  bVar3 = HeapInfo::IsSmallObject(allocSize);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x59b,"(HeapInfo::IsSmallObject(allocSize))",
                       "HeapInfo::IsSmallObject(allocSize)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  uVar5 = HeapBucketGroup<SmallAllocationBlockAttributes>::GetHeapBucketOffset();
  uVar6 = HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
          GetAllocatorHeadOffset();
  *allocatorAddress =
       (void *)((long)&(this->autoHeap).defaultHeap.heapBuckets[(int)(allocSize >> 4) - 1].
                       heapBucket.
                       super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
                       .
                       super_HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
                       .super_HeapBucket + (ulong)uVar6 + (ulong)uVar5);
  uVar7 = SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
          GetEndAddressOffset();
  *endAddressOffset = uVar7;
  uVar7 = SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
          GetFreeObjectListOffset();
  *freeListOffset = uVar7;
  if (!isOOPJIT) {
    pcVar1 = (char *)*allocatorAddress;
    pcVar9 = GetAddressOfAllocator<(Memory::ObjectInfoBits)0>(this,allocSize);
    if (pcVar1 != pcVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x5a9,"(allocatorAddress == GetAddressOfAllocator<NoBit>(allocSize))",
                         "allocatorAddress == GetAddressOfAllocator<NoBit>(allocSize)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    uVar7 = *endAddressOffset;
    uVar8 = GetEndAddressOffset<(Memory::ObjectInfoBits)0>(this,allocSize);
    if (uVar7 != uVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x5aa,"(endAddressOffset == GetEndAddressOffset<NoBit>(allocSize))",
                         "endAddressOffset == GetEndAddressOffset<NoBit>(allocSize)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    uVar7 = *freeListOffset;
    uVar8 = GetFreeObjectListOffset<(Memory::ObjectInfoBits)0>(this,allocSize);
    if (uVar7 != uVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x5ab,"(freeListOffset == GetFreeObjectListOffset<NoBit>(allocSize))",
                         "freeListOffset == GetFreeObjectListOffset<NoBit>(allocSize)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    bVar3 = AllowNativeCodeBumpAllocation(this);
    if (allowBumpAllocation != bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x5ac,"(allowBumpAllocation == AllowNativeCodeBumpAllocation())",
                         "allowBumpAllocation == AllowNativeCodeBumpAllocation()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  if (!allowBumpAllocation) {
    *freeListOffset = *endAddressOffset;
  }
  return;
}

Assistant:

void Recycler::GetNormalHeapBlockAllocatorInfoForNativeAllocation(size_t allocSize, void*& allocatorAddress, uint32& endAddressOffset, uint32& freeListOffset, bool allowBumpAllocation, bool isOOPJIT)
{
    Assert(HeapInfo::IsAlignedSize(allocSize));
    Assert(HeapInfo::IsSmallObject(allocSize));

    allocatorAddress = (char*)this + offsetof(Recycler, autoHeap)
        + offsetof(HeapInfoManager, defaultHeap)
        + offsetof(HeapInfo, heapBuckets)
        + sizeof(HeapBucketGroup<SmallAllocationBlockAttributes>)*((uint)(allocSize >> HeapConstants::ObjectAllocationShift) - 1)
        + HeapBucketGroup<SmallAllocationBlockAttributes>::GetHeapBucketOffset()
        + HeapBucketT<SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::GetAllocatorHeadOffset();

    endAddressOffset = SmallHeapBlockAllocator<SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::GetEndAddressOffset();
    freeListOffset = SmallHeapBlockAllocator<SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::GetFreeObjectListOffset();;

    if (!isOOPJIT)
    {
        Assert(allocatorAddress == GetAddressOfAllocator<NoBit>(allocSize));
        Assert(endAddressOffset == GetEndAddressOffset<NoBit>(allocSize));
        Assert(freeListOffset == GetFreeObjectListOffset<NoBit>(allocSize));
        Assert(allowBumpAllocation == AllowNativeCodeBumpAllocation());
    }

    if (!allowBumpAllocation)
    {
        freeListOffset = endAddressOffset;
    }
}